

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stresstest.c
# Opt level: O1

int verify_stable(int **array,int64_t size,int num_values)

{
  int64_t i_1;
  long lVar1;
  int iVar2;
  int64_t i;
  long lVar3;
  long lVar4;
  
  if (0 < num_values) {
    lVar1 = 0;
    lVar4 = 0;
    iVar2 = 0;
LAB_0011525d:
    do {
      lVar3 = lVar4;
      if (lVar4 < size) {
        do {
          lVar4 = lVar3;
          if (*original[lVar3] == iVar2) break;
          lVar3 = lVar3 + 1;
          lVar4 = size;
        } while (size != lVar3);
      }
      if (lVar4 != size) {
        lVar3 = lVar1;
        if (lVar1 < size) {
          do {
            lVar3 = lVar1;
            if (*array[lVar1] == iVar2) break;
            lVar1 = lVar1 + 1;
            lVar3 = size;
          } while (size != lVar1);
        }
        if (lVar3 == size) {
          return 0;
        }
        if (original[lVar4] != array[lVar3]) {
          return 0;
        }
        lVar4 = lVar4 + 1;
        lVar1 = lVar3 + 1;
        goto LAB_0011525d;
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 != num_values);
  }
  return 1;
}

Assistant:

int verify_stable(int **array, int64_t size, int num_values) {
  int value;
  int64_t i = 0;
  int64_t j = 0;

  for (value = 0; value < num_values; value++) {
    while (1) {
      i = find_next(original, i, size, value);

      /* unlikely, but possible */
      if (i == size) {
        break;
      }

      j = find_next(array, j, size, value);

      if (j == size) {
        return 0;
      }

      if (original[i] != array[j]) {
        return 0;
      }

      i++;
      j++;
    }
  }

  return 1;
}